

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator=(TPZFMatrix<Fad<float>_> *this,Fad<float> *value)

{
  long lVar1;
  Fad<float> *this_00;
  long lVar2;
  bool bVar3;
  
  lVar1 = (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  this_00 = this->fElem;
  lVar2 = 0;
  if (0 < lVar1) {
    lVar2 = lVar1;
  }
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    Fad<float>::operator=(this_00,value);
    this_00 = this_00 + 1;
  }
  (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return this;
}

Assistant:

TPZFMatrix<TVar>& TPZFMatrix<TVar>::operator=(const TVar value ) {
    int64_t size = ((int64_t)this->fRow) * this->fCol;
    TVar * dst   = fElem;
    for ( int64_t i = 0; i < size; i++ )
        *dst++ = value;
    this->fDecomposed = 0;
    return *this;
}